

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_dispatch.c
# Opt level: O0

void lj_dispatch_profile(lua_State *L,BCIns *pc)

{
  int iVar1;
  uint uVar2;
  undefined4 uVar3;
  long lVar4;
  BCReg BVar5;
  int *piVar6;
  ulong uVar7;
  BCIns *in_RSI;
  long in_RDI;
  global_State *g;
  BCIns *oldpc;
  void *cf;
  GCproto *pt;
  GCfunc *fn;
  int olderr;
  lua_State *in_stack_ffffffffffffffc0;
  
  piVar6 = __errno_location();
  iVar1 = *piVar6;
  uVar2 = *(uint *)((ulong)*(uint *)(*(long *)(in_RDI + 0x10) + -8) + 0x10);
  uVar7 = *(ulong *)(in_RDI + 0x30) & 0xfffffffffffffffc;
  uVar3 = *(undefined4 *)(uVar7 + 0x1c);
  *(int *)(uVar7 + 0x1c) = (int)in_RSI;
  lVar4 = *(long *)(in_RDI + 0x10);
  BVar5 = cur_topslot((GCproto *)((ulong)uVar2 - 0x40),in_RSI,*(uint32_t *)(uVar7 + 4));
  *(ulong *)(in_RDI + 0x18) = lVar4 + (ulong)BVar5 * 8;
  lj_profile_interpreter(in_stack_ffffffffffffffc0);
  *(undefined4 *)(uVar7 + 0x1c) = uVar3;
  uVar2 = *(uint *)(in_RDI + 8);
  *(int *)((ulong)uVar2 + 0x188) = (int)in_RDI;
  *(undefined4 *)((ulong)uVar2 + 0x160) = 0xffffffff;
  piVar6 = __errno_location();
  *piVar6 = iVar1;
  return;
}

Assistant:

void LJ_FASTCALL lj_dispatch_profile(lua_State *L, const BCIns *pc)
{
  ERRNO_SAVE
  GCfunc *fn = curr_func(L);
  GCproto *pt = funcproto(fn);
  void *cf = cframe_raw(L->cframe);
  const BCIns *oldpc = cframe_pc(cf);
  global_State *g;
  setcframe_pc(cf, pc);
  L->top = L->base + cur_topslot(pt, pc, cframe_multres_n(cf));
  lj_profile_interpreter(L);
  setcframe_pc(cf, oldpc);
  g = G(L);
  setgcref(g->cur_L, obj2gco(L));
  setvmstate(g, INTERP);
  ERRNO_RESTORE
}